

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<const_QObject_*,_QList<QCss::StyleRule>_> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>>::
findNode<QObject_const*>
          (Data<QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>> *this,QObject **key)

{
  byte bVar1;
  Node<const_QObject_*,_QList<QCss::StyleRule>_> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QObject_const*>(this,key);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<const_QObject_*,_QList<QCss::StyleRule>_> *)0x0;
  }
  else {
    pNVar2 = (Node<const_QObject_*,_QList<QCss::StyleRule>_> *)((BVar3.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }